

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O2

bool __thiscall ParamSurface::intersect(ParamSurface *this,Ray *ray,Hit *result)

{
  undefined8 uVar1;
  vec2f vVar2;
  bool bVar3;
  mat3f a;
  int iVar4;
  bool bVar5;
  float extraout_XMM0_Da;
  float fVar6;
  float fVar7;
  float extraout_XMM0_Db;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  point pVar14;
  vec3f vVar15;
  float local_13c;
  undefined4 in_stack_fffffffffffffed4;
  float fVar16;
  float fVar17;
  float fVar18;
  mat3f local_b8;
  Ray forwardray;
  Hit tmpresult;
  
  tmpresult.hit = false;
  tmpresult.p.x = 0.0;
  tmpresult.p.y = 0.0;
  tmpresult.p.z = 0.0;
  tmpresult.Ns.x = 0.0;
  tmpresult.Ns.y = 0.0;
  tmpresult.Ns.z = 0.0;
  tmpresult.Ng.x = 0.0;
  tmpresult.Ng.y = 0.0;
  tmpresult.Ng.z = 0.0;
  tmpresult.uv.x = 0.0;
  tmpresult.uv.y = 0.0;
  tmpresult.dpdu.x = 0.0;
  tmpresult.dpdu.y = 0.0;
  tmpresult.dpdu.z = 0.0;
  tmpresult.dpdv.x = 0.0;
  tmpresult.dpdv.y = 0.0;
  tmpresult.dpdv.z = 0.0;
  pVar14 = Ray::atParam(ray,0.01);
  forwardray.origin.z = pVar14.z;
  forwardray.dir.x = (ray->dir).x;
  forwardray.dir.y = (ray->dir).y;
  forwardray.dir.z = (ray->dir).z;
  forwardray.origin._0_8_ = pVar14._0_8_;
  iVar4 = (**(this->mesh->super_Primitive)._vptr_Primitive)(this->mesh,&forwardray,&tmpresult);
  if ((char)iVar4 == '\0') {
    bVar5 = false;
  }
  else {
    vVar15 = operator-(&tmpresult.p,&ray->origin);
    auVar11._0_8_ = (double)tmpresult.uv.x;
    auVar11._8_8_ = (double)tmpresult.uv.y;
    auVar11 = maxpd(auVar11,_DAT_00143040);
    auVar11 = minpd(auVar11,_DAT_00145740);
    fVar16 = 0.0;
    fVar17 = 0.0;
    fVar18 = 0.0;
    fVar10 = 0.0;
    local_13c = SQRT(vVar15.z * vVar15.z + vVar15.x * vVar15.x + vVar15.y * vVar15.y);
    iVar4 = 5;
    while( true ) {
      fVar7 = (float)auVar11._8_8_;
      vVar2.y = fVar7;
      vVar2.x = (float)auVar11._0_8_;
      fVar8 = fVar7;
      (*(this->super_Primitive)._vptr_Primitive[3])
                (this,&stack0xfffffffffffffed8,&stack0xfffffffffffffee8);
      bVar5 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar5) break;
      pVar14 = Ray::atParam(ray,local_13c);
      fVar9 = extraout_XMM0_Da - pVar14.x;
      fVar13 = extraout_XMM0_Db - pVar14.y;
      fVar6 = fVar8 - pVar14.z;
      operator-(&ray->dir);
      a.data[0][1] = fVar13;
      a.data[0][0] = fVar9;
      a.data[0][2] = fVar6;
      a.data[1][0] = (float)in_stack_fffffffffffffed4;
      a.data[1][1] = fVar16;
      a.data[1][2] = fVar17;
      a.data[2][0] = fVar18;
      a.data[2][1] = fVar8;
      a.data[2][2] = fVar10;
      inverse(a);
      vVar15 = operator*(&local_b8,(vec3f *)&stack0xfffffffffffffec8);
      local_13c = local_13c - vVar15.x;
      auVar12._0_8_ = (double)((float)auVar11._0_8_ - vVar15.y);
      auVar12._8_8_ = (double)(fVar7 - vVar15.z);
      auVar11 = maxpd(auVar12,_DAT_00143040);
      auVar11 = minpd(auVar11,_DAT_00145740);
    }
    fVar16 = extraout_XMM0_Da;
    fVar17 = extraout_XMM0_Db;
    pVar14 = Ray::atParam(ray,local_13c);
    fVar10 = fVar16 - pVar14.x;
    fVar7 = fVar17 - pVar14.y;
    fVar18 = fVar8 - pVar14.z;
    bVar3 = SQRT(fVar18 * fVar18 + fVar10 * fVar10 + fVar7 * fVar7) < 1e-06;
    bVar5 = 0.0 < local_13c && bVar3;
    if (0.0 < local_13c && bVar3) {
      vVar15 = cross((vec3f *)&stack0xfffffffffffffed8,(vec3f *)&stack0xfffffffffffffee8);
      local_b8.data[0][0]._0_3_ = vVar15.x._0_3_;
      local_b8.data[0]._3_4_ = vVar15._3_4_;
      local_b8.data[0]._7_4_ = vVar15._7_4_;
      local_b8.data[0][2]._3_1_ = vVar15.z._3_1_;
      vVar15 = normalized((vec3f *)&local_b8);
      result->hit = true;
      local_b8.data[0][1]._3_1_ = SUB41(fVar17,0);
      *(ulong *)&result->field_0x1 =
           CONCAT17(local_b8.data[0][1]._3_1_,CONCAT43(fVar16,local_b8.data[0][0]._0_3_));
      (result->p).y = fVar17;
      (result->p).z = fVar8;
      uVar1 = vVar15._0_8_;
      (result->Ns).x = (float)(int)uVar1;
      (result->Ns).y = (float)(int)((ulong)uVar1 >> 0x20);
      (result->Ns).z = vVar15.z;
      (result->Ng).x = (float)(int)uVar1;
      (result->Ng).y = (float)(int)((ulong)uVar1 >> 0x20);
      (result->Ng).z = vVar15.z;
      result->uv = vVar2;
      (result->dpdu).x = 0.0;
      (result->dpdu).y = 0.0;
      *(undefined8 *)&(result->dpdu).z = 0;
      (result->dpdv).y = 0.0;
      (result->dpdv).z = 0.0;
    }
  }
  return bVar5;
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		Hit tmpresult;
		Ray forwardray (ray.atParam(1e-2), ray.dir);
		bool boolres = mesh->intersect(forwardray, &tmpresult);
		if (!boolres) return false;
		// determine initial point
		float t = norm(tmpresult.p - ray.origin);
		float u = tmpresult.uv.x;
		float v = tmpresult.uv.y;
		u = fmin(1, fmax(0, u));
		v = fmin(1, fmax(0, v));
		vec3f p, dpdu, dpdv;
		// solve eqn(t,u,v): f(u,v) - origin - t * dir = 0
		for (int _=0; _<5; ++_)
		{
			p = surface(u,v,dpdu,dpdv) - ray.atParam(t);
			// vec3f t1,t2;
			// auto dpdu1 = (surface(u+1e-4,v,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// auto dpdv1 = (surface(u,v+1e-4,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// console.log(u,v);
			// console.log(dpdu, dpdv);
			// console.log(dpdu1, dpdv1);
			// console.log(norm(dpdu-dpdu1)/norm(dpdu), norm(dpdv-dpdv1)/norm(dpdv));
			// console.log(_,":",norm(p),",  ",t,u,v);
			// for (int i=0; i<3; ++i) for (int j=0; j<3; ++j)
			// console.log((inverse(mat3f(-ray.dir, dpdu, dpdv))*mat3f(-ray.dir, dpdu, dpdv))[i][j]);
			vec3f delt = inverse(mat3f(-ray.dir, dpdu, dpdv)) * p;
			t -= delt.x;
			u = fmin(1, fmax(0, u - delt.y));
			// v = v - delt.z;
			v = fmin(1, fmax(0, v - delt.z));
		}
		p = surface(u,v,dpdu,dpdv);
		if (norm(p-ray.atParam(t)) < 1e-6 && t>0) {
			vec3f N = normalized(cross(dpdu,dpdv));
			*result = {p,N,N,vec2f(u,v)};
			return true;
		}
		return false;
	}